

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
gmath::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,SVector<double,_6> *a)

{
  ostream *poVar1;
  SVector<double,_6> *in_RSI;
  ostream *in_RDI;
  double dVar2;
  int i;
  int local_14;
  
  poVar1 = std::operator<<(in_RDI,"[");
  dVar2 = SVector<double,_6>::operator[](in_RSI,0);
  std::ostream::operator<<(poVar1,dVar2);
  for (local_14 = 1; local_14 < 6; local_14 = local_14 + 1) {
    poVar1 = std::operator<<(in_RDI," ");
    dVar2 = SVector<double,_6>::operator[](in_RSI,local_14);
    std::ostream::operator<<(poVar1,dVar2);
  }
  std::operator<<(in_RDI,"]");
  return in_RDI;
}

Assistant:

std::basic_ostream<Ch, Tr> &operator<<(std::basic_ostream<Ch, Tr> &out, const SVector<T, n> &a)
{
  out << "[" << a[0];

  for (int i=1; i<n; i++)
  {
    out << " " << a[i];
  }

  out << "]";

  return out;
}